

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O1

int __thiscall
glcts::DrawElementsBaseVertexTests::init(DrawElementsBaseVertexTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParams;
  int extraout_EAX;
  DrawElementsBaseVertexTestBase *pDVar1;
  
  pDVar1 = (DrawElementsBaseVertexTestBase *)operator_new(0x408);
  extParams = &(this->super_TestCaseGroupBase).m_extParams;
  DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
            (pDVar1,(this->super_TestCaseGroupBase).m_context,extParams,"basevertex_behavior1",
             "Verifies basevertex draw calls work correctly for a number of different rendering pipeline and VAO configurations"
            );
  (pDVar1->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_02148f08;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DrawElementsBaseVertexTestBase *)operator_new(0x408);
  DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
            (pDVar1,(this->super_TestCaseGroupBase).m_context,extParams,"basevertex_behavior2",
             "Verifies basevertex draw calls work correctly for a number of different rendering pipeline and VAO configurations. Uses slightly different data set than basevertex_behavior."
            );
  (pDVar1->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_02148f48;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DrawElementsBaseVertexTestBase *)operator_new(0x408);
  DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
            (pDVar1,(this->super_TestCaseGroupBase).m_context,extParams,"AEP_shader_stages",
             "Verifies basevertex draw calls work correctly when geometry & tessellation shader stages are used in the rendering pipeline."
            );
  (pDVar1->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_02149008;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DrawElementsBaseVertexTestBase *)operator_new(0x408);
  DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
            (pDVar1,(this->super_TestCaseGroupBase).m_context,extParams,"underflow",
             "Verifies basevertex draw calls work correctly for negative basevertex values");
  (pDVar1->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_02148f88;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DrawElementsBaseVertexTestBase *)operator_new(0x408);
  DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
            (pDVar1,(this->super_TestCaseGroupBase).m_context,extParams,"overflow",
             "Verifies basevertex draw calls work correctly for overflowing basevertex values");
  (pDVar1->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_02148fc8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DrawElementsBaseVertexTestBase *)operator_new(0x410);
  DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
            (pDVar1,(this->super_TestCaseGroupBase).m_context,extParams,"valid_active_tf",
             "Tries to do \"base vertex\" draw calls while Transform Feedback is active");
  (pDVar1->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_02149048;
  *(undefined4 *)&pDVar1[1].super_TestCaseBase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DrawElementsBaseVertexTestBase *)operator_new(0x408);
  DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
            (pDVar1,(this->super_TestCaseGroupBase).m_context,extParams,"invalid_count_argument",
             "Tries to use invalid \'count\' argument values for the \"base vertex\" draw calls");
  (pDVar1->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_02149088;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DrawElementsBaseVertexTestBase *)operator_new(0x408);
  DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
            (pDVar1,(this->super_TestCaseGroupBase).m_context,extParams,
             "invalid_instancecount_argument",
             "Tries to use invalid \'instancecount\' argument values for glDrawElementsInstancedBaseVertexEXT (ES) or glDrawElementsInstancedBaseVertex (GL) draw call"
            );
  (pDVar1->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_021490c8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DrawElementsBaseVertexTestBase *)operator_new(0x408);
  DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
            (pDVar1,(this->super_TestCaseGroupBase).m_context,extParams,"invalid_mode_argument",
             "Tries to use invalid \'mode\' argument values for the \"base vertex\" draw calls");
  (pDVar1->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_02149108;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DrawElementsBaseVertexTestBase *)operator_new(0x408);
  DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
            (pDVar1,(this->super_TestCaseGroupBase).m_context,extParams,"invalid_primcount_argument"
             ,
             "Tries to use invalid \'primcount\' argument values for the \"base vertex\" draw calls"
            );
  (pDVar1->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_02149148;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DrawElementsBaseVertexTestBase *)operator_new(0x408);
  DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
            (pDVar1,(this->super_TestCaseGroupBase).m_context,extParams,
             "invalid_start_end_arguments",
             "Tries to use invalid \'start\' and \'end\' argument values for the glDrawRangeElementsBaseVertexEXT() (under ES) or glDrawRangeElementsBaseVertex() (under GL) draw call"
            );
  (pDVar1->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_02149188;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DrawElementsBaseVertexTestBase *)operator_new(0x408);
  DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
            (pDVar1,(this->super_TestCaseGroupBase).m_context,extParams,"invalid_type_argument",
             "Tries to use invalid \'type\' argument values for the \"base vertex\" draw calls");
  (pDVar1->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_021491c8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DrawElementsBaseVertexTestBase *)operator_new(0x408);
  DrawElementsBaseVertexTestBase::DrawElementsBaseVertexTestBase
            (pDVar1,(this->super_TestCaseGroupBase).m_context,extParams,"invalid_mapped_bos",
             "Tries to use mapped VBO and Index Buffer Object for the \"base vertex\" draw calls");
  (pDVar1->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawElementsBaseVertexTestBase_02149208;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  return extraout_EAX;
}

Assistant:

void DrawElementsBaseVertexTests::init()
{
	addChild(new DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior2(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorAEPShaderStages(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorUnderflow(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorOverflow(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeActiveTransformFeedbackTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeInvalidCountArgumentTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeInvalidInstanceCountArgumentTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeInvalidModeArgumentTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeInvalidPrimcountArgumentTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeInvalidStartEndArgumentsTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeInvalidTypeArgumentTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeMappedBufferObjectsTest(m_context, m_extParams));
}